

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketConnectionTestCase.cpp
# Opt level: O0

void __thiscall
CATCH2_INTERNAL_TEST_0::TestSessionConnection::TestSessionConnection(TestSessionConnection *this)

{
  SocketConnection *this_00;
  type pTVar1;
  TestSessionConnection *this_local;
  
  BaseSocketConnection::BaseSocketConnection(&this->super_BaseSocketConnection);
  std::unique_ptr<FIX::SocketConnection,std::default_delete<FIX::SocketConnection>>::
  unique_ptr<std::default_delete<FIX::SocketConnection>,void>
            ((unique_ptr<FIX::SocketConnection,std::default_delete<FIX::SocketConnection>> *)
             &this->pSocketConnection);
  this_00 = (SocketConnection *)operator_new(0x2100);
  pTVar1 = std::unique_ptr<TestSocketInitiator,_std::default_delete<TestSocketInitiator>_>::
           operator*(&(this->super_BaseSocketConnection).testInitiator);
  FIX::SocketConnection::SocketConnection
            (this_00,&pTVar1->super_SocketInitiator,
             &(this->super_BaseSocketConnection).initiatorSessionID,
             (this->super_BaseSocketConnection).socket,
             &(this->super_BaseSocketConnection).monitor.super_SocketMonitor);
  std::unique_ptr<FIX::SocketConnection,_std::default_delete<FIX::SocketConnection>_>::reset
            (&this->pSocketConnection,this_00);
  return;
}

Assistant:

TestSessionConnection()
        : BaseSocketConnection() {
      pSocketConnection.reset(new SocketConnection(*testInitiator, initiatorSessionID, socket, &monitor));
    }